

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  qsizetype *pqVar1;
  QItemSelectionRange **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QItemSelectionRange *pQVar5;
  QPersistentModelIndexData *pQVar6;
  QItemSelectionRange *pQVar7;
  QPersistentModelIndex QVar8;
  QPersistentModelIndexData *__old_val;
  QItemSelectionRange *__dest;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_70;
  QPersistentModelIndex local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
            super_QArrayDataPointer<QItemSelectionRange>.size;
    if ((lVar4 == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      pQVar6 = (args->tl).d;
      (args->tl).d = (QPersistentModelIndexData *)0x0;
      pQVar5[i].tl.d = pQVar6;
      pQVar6 = (args->br).d;
      (args->br).d = (QPersistentModelIndexData *)0x0;
      pQVar5[i].br.d = pQVar6;
      (this->super_QGenericArrayOps<QItemSelectionRange>).
      super_QArrayDataPointer<QItemSelectionRange>.size = i + 1;
      goto LAB_00464064;
    }
    if ((i == 0) &&
       (pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr,
       (QItemSelectionRange *)
       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar5)) {
      pQVar6 = (args->tl).d;
      (args->tl).d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].tl.d = pQVar6;
      pQVar6 = (args->br).d;
      (args->br).d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].br.d = pQVar6;
      ppQVar2 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
      (this->super_QGenericArrayOps<QItemSelectionRange>).
      super_QArrayDataPointer<QItemSelectionRange>.size = lVar4 + 1;
      goto LAB_00464064;
    }
  }
  pQVar6 = (args->tl).d;
  (args->tl).d = (QPersistentModelIndexData *)0x0;
  local_40.d = (args->br).d;
  (args->br).d = (QPersistentModelIndexData *)0x0;
  bVar9 = (this->super_QGenericArrayOps<QItemSelectionRange>).
          super_QArrayDataPointer<QItemSelectionRange>.size != 0;
  local_48.d = pQVar6;
  QArrayDataPointer<QItemSelectionRange>::detachAndGrow
            ((QArrayDataPointer<QItemSelectionRange> *)this,(uint)(i == 0 && bVar9),1,
             (QItemSelectionRange **)0x0,(QArrayDataPointer<QItemSelectionRange> *)0x0);
  QVar8.d = local_40.d;
  if (i == 0 && bVar9) {
    pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
             super_QArrayDataPointer<QItemSelectionRange>.ptr;
    local_48.d = (QPersistentModelIndexData *)0x0;
    pQVar5[-1].tl.d = pQVar6;
    local_40.d = (QPersistentModelIndexData *)0x0;
    pQVar5[-1].br.d = QVar8.d;
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .ptr = pQVar5 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
              super_QArrayDataPointer<QItemSelectionRange>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    pQVar7 = (this->super_QGenericArrayOps<QItemSelectionRange>).
             super_QArrayDataPointer<QItemSelectionRange>.ptr;
    pQVar5 = pQVar7 + i;
    __dest = pQVar5 + 1;
    local_70.nInserts = 1;
    local_70.bytes =
         ((this->super_QGenericArrayOps<QItemSelectionRange>).
          super_QArrayDataPointer<QItemSelectionRange>.size - i) * 0x10;
    local_70.data = (QArrayDataPointer<QItemSelectionRange> *)this;
    local_70.displaceTo = __dest;
    memmove(__dest,pQVar7 + i,local_70.bytes);
    QVar8.d = local_40.d;
    local_48.d = (QPersistentModelIndexData *)0x0;
    (pQVar5->tl).d = pQVar6;
    local_40.d = (QPersistentModelIndexData *)0x0;
    (pQVar5->br).d = QVar8.d;
    local_70.displaceFrom = __dest;
    Inserter::~Inserter(&local_70);
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  QPersistentModelIndex::~QPersistentModelIndex(&local_48);
LAB_00464064:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }